

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiIniData * FindWindowSettings(char *name)

{
  ImU32 IVar1;
  value_type *pvVar2;
  ImVector<ImGuiIniData> *this;
  int i;
  int i_00;
  
  this = &GImGui->Settings;
  IVar1 = ImHash(name,0,0);
  i_00 = 0;
  do {
    if (i_00 == this->Size) {
      return (ImGuiIniData *)0x0;
    }
    pvVar2 = ImVector<ImGuiIniData>::operator[](this,i_00);
    i_00 = i_00 + 1;
  } while (pvVar2->Id != IVar1);
  return pvVar2;
}

Assistant:

static ImGuiIniData* FindWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    ImGuiID id = ImHash(name, 0);
    for (int i = 0; i != g.Settings.Size; i++)
    {
        ImGuiIniData* ini = &g.Settings[i];
        if (ini->Id == id)
            return ini;
    }
    return NULL;
}